

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

void ma_paged_audio_buffer_data_uninit
               (ma_paged_audio_buffer_data *pData,ma_allocation_callbacks *pAllocationCallbacks)

{
  undefined8 *puVar1;
  long in_RDI;
  ma_paged_audio_buffer_page *pNext;
  ma_paged_audio_buffer_page *pPage;
  ma_allocation_callbacks *in_stack_ffffffffffffff88;
  undefined8 local_48;
  
  if (in_RDI != 0) {
    local_48 = *(undefined8 **)(in_RDI + 8);
    while (local_48 != (undefined8 *)0x0) {
      puVar1 = (undefined8 *)*local_48;
      ma_free(local_48,in_stack_ffffffffffffff88);
      local_48 = puVar1;
    }
  }
  return;
}

Assistant:

MA_API void ma_paged_audio_buffer_data_uninit(ma_paged_audio_buffer_data* pData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_paged_audio_buffer_page* pPage;

    if (pData == NULL) {
        return;
    }

    /* All pages need to be freed. */
    pPage = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pData->head.pNext);
    while (pPage != NULL) {
        ma_paged_audio_buffer_page* pNext = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pPage->pNext);

        ma_free(pPage, pAllocationCallbacks);
        pPage = pNext;
    }
}